

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_PrintMapKeysTest_Test::TestBody
          (MessageDifferencerTest_PrintMapKeysTest_Test *this)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>_>
  *pVVar2;
  Map<std::__cxx11::string,int> *pMVar3;
  long lVar4;
  pointer *__ptr;
  char *pcVar5;
  char *in_R9;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  AssertHelper local_400;
  AssertionResult gtest_ar_1;
  string diff_with_any;
  Any any1;
  AssertionResult gtest_ar__1;
  Any any2;
  string diff;
  MessageDifferencer differencer;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&msg1.field_0._impl_.item_.super_RepeatedPtrFieldBase);
  pMVar3 = (Map<std::__cxx11::string,int> *)
           internal::
           TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::MutableMap(&(pVVar2->field_0)._impl_.mp_.
                         super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       );
  any1.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&differencer,(char (*) [6])"key_a",(int *)&any1);
  any2.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = 2;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&differencer.default_field_comparator_.super_SimpleFieldComparator.map_tolerance_,
             (char (*) [6])"key_b",(int *)&any2);
  diff._M_dataplus._M_p._0_4_ = 3;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&differencer.force_compare_no_presence_fields_,(char (*) [6])"key_c",(int *)&diff);
  Map<std::__cxx11::string,int>::insert<std::pair<std::__cxx11::string,int>const*>
            (pMVar3,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     *)&differencer,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)((long)&differencer.require_no_presence_fields_.ids_.
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                + 8));
  lVar4 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&differencer.reporter_ + lVar4));
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x28);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&msg2.field_0._impl_.item_.super_RepeatedPtrFieldBase);
  pMVar3 = (Map<std::__cxx11::string,int> *)
           internal::
           TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::MutableMap(&(pVVar2->field_0)._impl_.mp_.
                         super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       );
  any1.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&differencer,(char (*) [6])"key_a",(int *)&any1);
  any2.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = 3;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&differencer.default_field_comparator_.super_SimpleFieldComparator.map_tolerance_,
             (char (*) [6])"key_b",(int *)&any2);
  diff._M_dataplus._M_p._0_4_ = 4;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&differencer.force_compare_no_presence_fields_,(char (*) [6])"key_d",(int *)&diff);
  Map<std::__cxx11::string,int>::insert<std::pair<std::__cxx11::string,int>const*>
            (pMVar3,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     *)&differencer,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)((long)&differencer.require_no_presence_fields_.ids_.
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                + 8));
  lVar4 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&differencer.reporter_ + lVar4));
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x28);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  diff._M_dataplus._M_p = (pointer)&diff.field_2;
  diff._M_string_length = 0;
  diff.field_2._M_local_buf[0] = '\0';
  util::MessageDifferencer::ReportDifferencesToString(&differencer,&diff);
  bVar1 = util::MessageDifferencer::Compare(&differencer,&msg1.super_Message,&msg2.super_Message);
  any2.super_Message.super_MessageLite._vptr_MessageLite._0_1_ = !bVar1;
  any2.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&diff_with_any);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&any1,(internal *)&any2,(AssertionResult *)0xf0d901,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x92e,(char *)CONCAT44(any1.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                                       any1.super_Message.super_MessageLite._vptr_MessageLite._0_4_)
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1,(Message *)&diff_with_any);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&any1);
    if (diff_with_any._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)diff_with_any._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&any2.super_Message.super_MessageLite._internal_metadata_);
  testing::internal::CmpHelperEQ<char[95],std::__cxx11::string>
            ((internal *)&any1,
             "\"modified: item[0].mp[key_b]: 2 -> 3\\n\" \"added: item[0].mp[key_d]: 4\\n\" \"deleted: item[0].mp[key_c]: 3\\n\""
             ,"diff",(char (*) [95])
                     "modified: item[0].mp[key_b]: 2 -> 3\nadded: item[0].mp[key_d]: 4\ndeleted: item[0].mp[key_c]: 3\n"
             ,&diff);
  if ((char)any1.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&any2);
    if (any1.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar5 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar5 = *(char **)any1.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&diff_with_any,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x933,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&diff_with_any,(Message *)&any2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&diff_with_any);
    if ((long *)CONCAT44(any2.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                         any2.super_Message.super_MessageLite._vptr_MessageLite._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(any2.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                                     any2.super_Message.super_MessageLite._vptr_MessageLite._0_4_) +
                  8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&any1.super_Message.super_MessageLite._internal_metadata_);
  Any::Any(&any1);
  Any::Any(&any2);
  Any::PackFrom(&any1,&msg1.super_Message);
  Any::PackFrom(&any2,&msg2.super_Message);
  diff_with_any._M_dataplus._M_p = (pointer)&diff_with_any.field_2;
  diff_with_any._M_string_length = 0;
  diff_with_any.field_2._M_local_buf[0] = '\0';
  util::MessageDifferencer::ReportDifferencesToString(&differencer,&diff_with_any);
  bVar1 = util::MessageDifferencer::Compare(&differencer,&any1.super_Message,&any2.super_Message);
  gtest_ar__1.success_ = !bVar1;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1,(internal *)&gtest_ar__1,
               (AssertionResult *)"differencer.Compare(any1, any2)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x93a,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
    testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (local_408._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_408._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  testing::internal::CmpHelperEQ<char[95],std::__cxx11::string>
            ((internal *)&gtest_ar_1,
             "\"modified: item[0].mp[key_b]: 2 -> 3\\n\" \"added: item[0].mp[key_d]: 4\\n\" \"deleted: item[0].mp[key_c]: 3\\n\""
             ,"diff_with_any",
             (char (*) [95])
             "modified: item[0].mp[key_b]: 2 -> 3\nadded: item[0].mp[key_d]: 4\ndeleted: item[0].mp[key_c]: 3\n"
             ,&diff_with_any);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar5 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x93f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_408,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_408);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&diff_with_any);
  Any::~Any(&any2);
  Any::~Any(&any1);
  std::__cxx11::string::~string((string *)&diff);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, PrintMapKeysTest) {
  // Note that because map is unordered, the comparison
  // output string for test evaluation cannot assume order of
  // output of fields (IOW if two fields are deleted
  // one cannot assume which deleted field log will be printed first).
  // Test currently just has a single record per operation to address this.
  // This should only be a limitation for EXPECT_EQ evaluation.
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->mutable_mp()->insert({{"key_a", 1}, {"key_b", 2}, {"key_c", 3}});
  item = msg2.add_item();
  item->mutable_mp()->insert({{"key_a", 1}, {"key_b", 3}, {"key_d", 4}});

  util::MessageDifferencer differencer;
  std::string diff;
  differencer.ReportDifferencesToString(&diff);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: item[0].mp[key_b]: 2 -> 3\n"
      "added: item[0].mp[key_d]: 4\n"
      "deleted: item[0].mp[key_c]: 3\n",
      diff);

  google::protobuf::Any any1, any2;
  any1.PackFrom(msg1);
  any2.PackFrom(msg2);
  std::string diff_with_any;
  differencer.ReportDifferencesToString(&diff_with_any);
  EXPECT_FALSE(differencer.Compare(any1, any2));
  EXPECT_EQ(
      "modified: item[0].mp[key_b]: 2 -> 3\n"
      "added: item[0].mp[key_d]: 4\n"
      "deleted: item[0].mp[key_c]: 3\n",
      diff_with_any);
}